

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::OP_InitForInEnumerator
               (Var enumerable,ForInObjectEnumerator *enumerator,ScriptContext *scriptContext,
               EnumeratorCache *forInCache)

{
  BOOL BVar1;
  RecyclableObject *local_30;
  RecyclableObject *enumerableObject;
  EnumeratorCache *forInCache_local;
  ScriptContext *scriptContext_local;
  ForInObjectEnumerator *enumerator_local;
  Var enumerable_local;
  
  enumerableObject = (RecyclableObject *)forInCache;
  forInCache_local = (EnumeratorCache *)scriptContext;
  scriptContext_local = (ScriptContext *)enumerator;
  enumerator_local = (ForInObjectEnumerator *)enumerable;
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(enumerable);
  BVar1 = GetPropertyObject(enumerator_local,(ScriptContext *)forInCache_local,&local_30);
  if (BVar1 == 0) {
    local_30 = (RecyclableObject *)0x0;
  }
  ForInObjectEnumerator::Initialize
            ((ForInObjectEnumerator *)scriptContext_local,local_30,(ScriptContext *)forInCache_local
             ,false,(EnumeratorCache *)enumerableObject);
  return;
}

Assistant:

void JavascriptOperators::OP_InitForInEnumerator(Var enumerable, ForInObjectEnumerator * enumerator, ScriptContext* scriptContext, EnumeratorCache * forInCache)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_OP_InitForInEnumerator);
        RecyclableObject* enumerableObject;
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(enumerable);
#endif
        if (!GetPropertyObject(enumerable, scriptContext, &enumerableObject))
        {
            enumerableObject = nullptr;
        }

        enumerator->Initialize(enumerableObject, scriptContext, false, forInCache);
        JIT_HELPER_END(Op_OP_InitForInEnumerator);
    }